

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_mesh_completeness.cc
# Opt level: O0

shared_ptr<spdlog::logger> * lf::mesh::test_utils::WatertightLogger(void)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  if (WatertightLogger()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&WatertightLogger()::logger);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"lf::mesh::test_utils::WatertightLogger",&local_29);
      lf::base::InitLogger((base *)&WatertightLogger::logger,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::shared_ptr<spdlog::logger>::~shared_ptr,&WatertightLogger::logger,
                   &__dso_handle);
      __cxa_guard_release(&WatertightLogger()::logger);
    }
  }
  return &WatertightLogger::logger;
}

Assistant:

std::shared_ptr<spdlog::logger>& WatertightLogger() {
  static auto logger =
      base::InitLogger("lf::mesh::test_utils::WatertightLogger");
  return logger;
}